

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O2

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)

{
  long lVar1;
  
  if (pchglist->pchgs != (jpc_pchg_t **)0x0) {
    for (lVar1 = 0; lVar1 < pchglist->numpchgs; lVar1 = lVar1 + 1) {
      jas_free(pchglist->pchgs[lVar1]);
    }
    jas_free(pchglist->pchgs);
  }
  jas_free(pchglist);
  return;
}

Assistant:

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)
{
	int pchgno;
	if (pchglist->pchgs) {
		for (pchgno = 0; pchgno < pchglist->numpchgs; ++pchgno) {
			jpc_pchg_destroy(pchglist->pchgs[pchgno]);
		}
		jas_free(pchglist->pchgs);
	}
	jas_free(pchglist);
}